

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::clear_ClassLabels(TextClassifier *this)

{
  StringVector *this_00;
  ClassLabelsCase CVar1;
  Arena *pAVar2;
  TextClassifier *this_local;
  
  CVar1 = ClassLabels_case(this);
  if ((((CVar1 != CLASSLABELS_NOT_SET) && (CVar1 == kStringClassLabels)) &&
      (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite),
      pAVar2 == (Arena *)0x0)) &&
     (this_00 = (this->ClassLabels_).stringclasslabels_, this_00 != (StringVector *)0x0)) {
    StringVector::~StringVector(this_00);
    operator_delete(this_00,0x30);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TextClassifier::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.TextClassifier)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      if (GetArenaForAllocation() == nullptr) {
        delete ClassLabels_.stringclasslabels_;
      }
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}